

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  string *psVar5;
  long lVar6;
  allocator<char> local_3e1;
  string local_3e0;
  cmAlphaNum local_3c0;
  cmAlphaNum local_390;
  string local_360;
  Status local_340;
  undefined1 local_338 [8];
  string saveFile;
  string file;
  string dir;
  string local_2d0;
  undefined1 local_2b0 [8];
  string makeProgram;
  string local_270 [32];
  ostringstream local_250 [8];
  ostringstream err;
  allocator<char> local_d1;
  string local_d0;
  string *local_b0;
  undefined1 local_a8 [8];
  string setMakeProgram;
  string local_80;
  string *local_60;
  allocator<char> local_41;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  local_20 = mf;
  mf_local = (cmMakefile *)this;
  uVar3 = std::__cxx11::string::empty();
  pcVar1 = local_20;
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CMAKE_MAKE_PROGRAM",
               (allocator<char> *)(setMakeProgram.field_2._M_local_buf + 0xf));
    local_60 = (string *)cmMakefile::GetDefinition(pcVar1,&local_80);
    bVar2 = cmIsOff((cmValue)local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)(setMakeProgram.field_2._M_local_buf + 0xf))
    ;
    if (bVar2) {
      cmMakefile::GetModulesFile((string *)local_a8,local_20,&this->FindMakeProgramFile);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cmMakefile::ReadListFile(local_20,(string *)local_a8);
      }
      std::__cxx11::string::~string((string *)local_a8);
    }
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_MAKE_PROGRAM",&local_d1);
    local_b0 = (string *)cmMakefile::GetDefinition(pcVar1,&local_d0);
    bVar2 = cmIsOff((cmValue)local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    pcVar1 = local_20;
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_250);
      poVar4 = std::operator<<((ostream *)local_250,
                               "CMake was unable to find a build program corresponding to \"");
      (*this->_vptr_cmGlobalGenerator[3])(local_270);
      poVar4 = std::operator<<(poVar4,local_270);
      poVar4 = std::operator<<(poVar4,"\".  CMAKE_MAKE_PROGRAM is not set.  You ");
      std::operator<<(poVar4,"probably need to select a different build tool.");
      std::__cxx11::string::~string(local_270);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error((string *)((long)&makeProgram.field_2 + 8));
      std::__cxx11::string::~string((string *)(makeProgram.field_2._M_local_buf + 8));
      cmSystemTools::SetFatalErrorOccurred();
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_250);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"CMAKE_MAKE_PROGRAM",
                 (allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      psVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_2d0);
      std::__cxx11::string::string((string *)local_2b0,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      lVar6 = std::__cxx11::string::find((char)local_2b0,0x20);
      if (lVar6 != -1) {
        std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(saveFile.field_2._M_local_buf + 8));
        cmsys::SystemTools::SplitProgramPath
                  ((string *)local_2b0,(string *)(file.field_2._M_local_buf + 8),
                   (string *)(saveFile.field_2._M_local_buf + 8),true);
        std::__cxx11::string::string
                  ((string *)local_338,(string *)(saveFile.field_2._M_local_buf + 8));
        local_340 = cmsys::SystemTools::GetShortPath((string *)local_2b0,(string *)local_2b0);
        cmsys::SystemTools::SplitProgramPath
                  ((string *)local_2b0,(string *)((long)&file.field_2 + 8),
                   (string *)((long)&saveFile.field_2 + 8),true);
        cmAlphaNum::cmAlphaNum(&local_390,(string *)((long)&file.field_2 + 8));
        cmAlphaNum::cmAlphaNum(&local_3c0,'/');
        cmStrCat<std::__cxx11::string>
                  (&local_360,&local_390,&local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
        std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        pcVar1 = local_20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e0,"CMAKE_MAKE_PROGRAM",&local_3e1);
        cmMakefile::AddCacheDefinition
                  (pcVar1,&local_3e0,(string *)local_2b0,"make program",FILEPATH,false);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator(&local_3e1);
        std::__cxx11::string::~string((string *)local_338);
        std::__cxx11::string::~string((string *)(saveFile.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_2b0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,&local_41);
    cmSystemTools::Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (this->FindMakeProgramFile.empty()) {
    cmSystemTools::Error(
      "Generator implementation error, "
      "all generators must specify this->FindMakeProgramFile");
    return false;
  }
  if (cmIsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM"))) {
    std::string setMakeProgram = mf->GetModulesFile(this->FindMakeProgramFile);
    if (!setMakeProgram.empty()) {
      mf->ReadListFile(setMakeProgram);
    }
  }
  if (cmIsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM"))) {
    std::ostringstream err;
    err << "CMake was unable to find a build program corresponding to \""
        << this->GetName() << "\".  CMAKE_MAKE_PROGRAM is not set.  You "
        << "probably need to select a different build tool.";
    cmSystemTools::Error(err.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string makeProgram = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  // if there are spaces in the make program use short path
  // but do not short path the actual program name, as
  // this can cause trouble with VSExpress
  if (makeProgram.find(' ') != std::string::npos) {
    std::string dir;
    std::string file;
    cmSystemTools::SplitProgramPath(makeProgram, dir, file);
    std::string saveFile = file;
    cmSystemTools::GetShortPath(makeProgram, makeProgram);
    cmSystemTools::SplitProgramPath(makeProgram, dir, file);
    makeProgram = cmStrCat(dir, '/', saveFile);
    mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", makeProgram, "make program",
                           cmStateEnums::FILEPATH);
  }
  return true;
}